

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O3

void __thiscall QColumnView::scrollTo(QColumnView *this,QModelIndex *index,ScrollHint hint)

{
  QColumnViewPrivate *this_00;
  QAbstractItemModel *pQVar1;
  QWidgetData *pQVar2;
  QAbstractItemView *pQVar3;
  int iVar4;
  LayoutDirection LVar5;
  ulong uVar6;
  QWidget *pQVar7;
  QStyle *pQVar8;
  QScrollBar *this_01;
  int iVar9;
  QAbstractItemView **ppQVar10;
  ulong uVar11;
  ulong uVar12;
  DeletionPolicy DVar13;
  int iVar14;
  long in_FS_OFFSET;
  undefined8 local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  anon_union_24_3_e3d07ef4_for_data local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) &&
     (this_00 = *(QColumnViewPrivate **)
                 &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.
                  super_QWidget.field_0x8, (this_00->columns).d.size != 0)) {
    iVar4 = QAbstractAnimation::state();
    if (iVar4 != 2) {
      QAbstractAnimation::stop();
      QColumnViewPrivate::closeColumns(this_00,index,true);
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      pQVar1 = (index->m).ptr;
      if (pQVar1 == (QAbstractItemModel *)0x0) {
        local_78 = (undefined1 *)0xffffffffffffffff;
        puStack_70 = (undefined1 *)0x0;
        local_68 = (undefined1 *)0x0;
      }
      else {
        (**(code **)(*(long *)pQVar1 + 0x68))(&local_78,pQVar1,index);
      }
      if ((this_00->columns).d.size != 0) {
        ppQVar10 = (this_00->columns).d.ptr;
        uVar12 = 0;
        iVar4 = 0;
        do {
          QAbstractItemView::rootIndex
                    ((QModelIndex *)&local_58,(QAbstractItemView *)ppQVar10[uVar12]);
          if ((((int)local_78 == local_58._0_4_) && (local_78._4_4_ == local_58._4_4_)) &&
             ((puStack_70 == (undefined1 *)local_58._8_8_ &&
              (local_68 == (undefined1 *)local_58._16_8_)))) {
            uVar6 = (this_00->columns).d.size;
            break;
          }
          ppQVar10 = (this_00->columns).d.ptr;
          pQVar2 = (ppQVar10[uVar12]->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
          uVar6 = (this_00->columns).d.size;
          iVar4 = ((iVar4 + (pQVar2->crect).x2.m_i) - (pQVar2->crect).x1.m_i) + 1;
          uVar12 = uVar12 + 1;
        } while (uVar12 < uVar6);
        if (uVar6 != uVar12) {
          uVar11 = (ulong)((int)uVar12 + 1);
          ppQVar10 = (this_00->columns).d.ptr;
          pQVar2 = (ppQVar10[uVar12]->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
          iVar14 = ((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1;
          if (uVar11 < uVar6) {
            pQVar2 = (ppQVar10[uVar11]->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
            iVar14 = ((iVar14 + (pQVar2->crect).x2.m_i) - (pQVar2->crect).x1.m_i) + 1;
          }
          LVar5 = QWidget::layoutDirection((QWidget *)this);
          if (LVar5 == RightToLeft) {
            pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
            iVar9 = ((pQVar7->data->crect).x2.m_i - (iVar4 + (pQVar7->data->crect).x1.m_i)) + 1;
            iVar4 = iVar9 - iVar14;
          }
          else {
            iVar9 = iVar14 + iVar4;
          }
          iVar14 = (**(code **)(*(long *)&(this->super_QAbstractItemView).super_QAbstractScrollArea.
                                          super_QFrame.super_QWidget + 0x2b0))(this);
          if (iVar4 != -iVar14 && SBORROW4(iVar4,-iVar14) == iVar4 + iVar14 < 0) {
            iVar14 = (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                            super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                 0x2b0))(this);
            pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
            if (iVar9 <= ((pQVar7->data->crect).x2.m_i - (iVar14 + (pQVar7->data->crect).x1.m_i)) +
                         1) {
              pQVar3 = (this_00->columns).d.ptr[uVar12];
              (**(code **)(*(long *)&(pQVar3->super_QAbstractScrollArea).super_QFrame.super_QWidget
                          + 0x1e8))(pQVar3,index,0);
              QColumnViewPrivate::changeCurrentColumn(this_00);
              goto LAB_00561614;
            }
          }
          LVar5 = QWidget::layoutDirection((QWidget *)this);
          if (LVar5 == RightToLeft) {
            if (iVar4 < 0) {
              pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
              iVar4 = ((pQVar7->data->crect).x2.m_i - (iVar4 + (pQVar7->data->crect).x1.m_i)) + 1;
            }
            else {
              iVar4 = (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                             super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                  0x2b0))(this);
              iVar4 = iVar4 + iVar9;
            }
          }
          else {
            iVar14 = (**(code **)(*(long *)&(this->super_QAbstractItemView).
                                            super_QAbstractScrollArea.super_QFrame.super_QWidget +
                                 0x2b0))(this);
            if (iVar4 != -iVar14 && SBORROW4(iVar4,-iVar14) == iVar4 + iVar14 < 0) {
              pQVar7 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
              iVar4 = iVar9 + ~(pQVar7->data->crect).x2.m_i + (pQVar7->data->crect).x1.m_i;
            }
          }
          pQVar8 = QWidget::style((QWidget *)this);
          iVar14 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x71,0,this,0);
          if (iVar14 == 0) {
            this_01 = QAbstractScrollArea::horizontalScrollBar((QAbstractScrollArea *)this);
            QAbstractSlider::setValue(&this_01->super_QAbstractSlider,iVar4);
          }
          else {
            DVar13 = (DeletionPolicy)&this_00->currentAnimation;
            QVariantAnimation::setDuration(DVar13);
            ::QVariant::QVariant((QVariant *)&local_58,iVar4);
            QVariantAnimation::setEndValue((QVariant *)&this_00->currentAnimation);
            ::QVariant::~QVariant((QVariant *)&local_58);
            QAbstractAnimation::start(DVar13);
          }
        }
      }
    }
  }
LAB_00561614:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QColumnView::scrollTo(const QModelIndex &index, ScrollHint hint)
{
    Q_D(QColumnView);
    Q_UNUSED(hint);
    if (!index.isValid() || d->columns.isEmpty())
        return;

#if QT_CONFIG(animation)
    if (d->currentAnimation.state() == QPropertyAnimation::Running)
        return;

    d->currentAnimation.stop();
#endif // animation

    // Fill up what is needed to get to index
    d->closeColumns(index, true);

    QModelIndex indexParent = index.parent();
    // Find the left edge of the column that contains index
    int currentColumn = 0;
    int leftEdge = 0;
    while (currentColumn < d->columns.size()) {
        if (indexParent == d->columns.at(currentColumn)->rootIndex())
            break;
        leftEdge += d->columns.at(currentColumn)->width();
        ++currentColumn;
    }

    // Don't let us scroll above the root index
    if (currentColumn == d->columns.size())
        return;

    int indexColumn = currentColumn;
    // Find the width of what we want to show (i.e. the right edge)
    int visibleWidth = d->columns.at(currentColumn)->width();
    // We want to always try to show two columns
    if (currentColumn + 1 < d->columns.size()) {
        ++currentColumn;
        visibleWidth += d->columns.at(currentColumn)->width();
    }

    int rightEdge = leftEdge + visibleWidth;
    if (isRightToLeft()) {
        leftEdge = viewport()->width() - leftEdge;
        rightEdge = leftEdge - visibleWidth;
        qSwap(rightEdge, leftEdge);
    }

    // If it is already visible don't animate
    if (leftEdge > -horizontalOffset()
        && rightEdge <= ( -horizontalOffset() + viewport()->size().width())) {
            d->columns.at(indexColumn)->scrollTo(index);
            d->changeCurrentColumn();
            return;
    }

    int newScrollbarValue = 0;
    if (isRightToLeft()) {
        if (leftEdge < 0) {
            // scroll to the right
            newScrollbarValue = viewport()->size().width() - leftEdge;
        } else {
            // scroll to the left
            newScrollbarValue = rightEdge + horizontalOffset();
        }
    } else {
        if (leftEdge > -horizontalOffset()) {
            // scroll to the right
            newScrollbarValue = rightEdge - viewport()->size().width();
        } else {
            // scroll to the left
            newScrollbarValue = leftEdge;
        }
    }

#if QT_CONFIG(animation)
    if (const int animationDuration = style()->styleHint(QStyle::SH_Widget_Animation_Duration, nullptr, this)) {
        d->currentAnimation.setDuration(animationDuration);
        d->currentAnimation.setEndValue(newScrollbarValue);
        d->currentAnimation.start();
    } else
#endif // animation
    {
        horizontalScrollBar()->setValue(newScrollbarValue);
    }
}